

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::percolateUp(Heap<Gluco::Solver::VarOrderLt> *this,int i)

{
  double dVar1;
  int iVar2;
  vec<double> *pvVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  
  pvVar3 = (this->lt).activity;
  piVar4 = (this->heap).data;
  iVar2 = piVar4[i];
  piVar5 = (this->indices).data;
  while( true ) {
    if (i == 0) break;
    iVar7 = i + -1 >> 1;
    pdVar6 = pvVar3->data;
    dVar1 = pdVar6[iVar2];
    pdVar6 = pdVar6 + piVar4[iVar7];
    if (dVar1 < *pdVar6 || dVar1 == *pdVar6) break;
    piVar4[i] = piVar4[iVar7];
    piVar5[piVar4[iVar7]] = i;
    i = iVar7;
  }
  piVar4[i] = iVar2;
  piVar5[iVar2] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }